

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

bool __thiscall idx2::path::operator==(path *this,path *Other)

{
  bool bVar1;
  bool bVar2;
  stref *Lhs;
  stref *Rhs;
  long lVar3;
  
  if (this->NParts == Other->NParts) {
    bVar2 = this->NParts < 1;
    if ((0 < this->NParts) && (bVar1 = operator!=(this->Parts,Other->Parts), !bVar1)) {
      Lhs = this->Parts;
      Rhs = Other->Parts;
      lVar3 = 0;
      do {
        Rhs = Rhs + 1;
        Lhs = Lhs + 1;
        lVar3 = lVar3 + 1;
        bVar2 = this->NParts <= lVar3;
        if (this->NParts <= lVar3) {
          return bVar2;
        }
        bVar1 = operator!=(Lhs,Rhs);
      } while (!bVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
path::operator==(const path& Other) const
{
  if (this->NParts != Other.NParts)
    return false;
  for (int I = 0; I < this->NParts; ++I)
  {
    if (this->Parts[I] != Other.Parts[I])
      return false;
  }
  return true;
}